

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::RandomSSBOLayoutCase::init
          (RandomSSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *this_00;
  pointer pBVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BufferBlock *this_01;
  undefined8 in_R8;
  int iVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> layoutFlagCandidates;
  VarType type;
  BufferVar local_a0;
  string name;
  Random rnd;
  ShaderInterface *pSVar9;
  
  deRandom_init(&rnd.m_rnd,this->m_seed);
  uVar3 = de::Random::getInt((Random *)&rnd.m_rnd,1,this->m_maxBlocks);
  if ((int)uVar3 < 1) {
    uVar3 = 0;
  }
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  uVar8 = 0;
  pSVar9 = this_00;
  do {
    if (uVar8 == uVar3) {
      return (int)pSVar9;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&name,"Block",(allocator<char> *)&type);
    std::operator+(&local_a0.m_name,&name,(char)this->m_blockNdx + 'A');
    this_01 = bb::ShaderInterface::allocBlock
                        (this_00,(char *)CONCAT44(local_a0.m_name._M_dataplus._M_p._4_4_,
                                                  local_a0.m_name._M_dataplus._M_p._0_4_));
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&name);
    iVar4 = 0;
    if (0 < this->m_maxInstances) {
      fVar13 = deRandom_getFloat(&rnd.m_rnd);
      if (fVar13 < 0.3) {
        iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,this->m_maxInstances);
      }
    }
    iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,1,this->m_maxBlockMembers);
    if (iVar4 < 1) {
      bVar2 = de::Random::getBool((Random *)&rnd.m_rnd);
      if (bVar2) goto LAB_0046db5b;
    }
    else {
      bb::BufferBlock::setArraySize(this_01,iVar4);
LAB_0046db5b:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,"block",(allocator<char> *)&type);
      std::operator+(&local_a0.m_name,&name,(char)this->m_blockNdx + 'A');
      std::__cxx11::string::assign((char *)&this_01->m_instanceName);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&name);
    }
    layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.m_name._M_dataplus._M_p._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&layoutFlagCandidates,(uint *)&local_a0);
    uVar6 = this->m_features;
    if ((uVar6 >> 8 & 1) != 0) {
      local_a0.m_name._M_dataplus._M_p._0_4_ = 2;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&layoutFlagCandidates,(uint *)&local_a0);
      uVar6 = this->m_features;
    }
    if ((uVar6 >> 9 & 1) != 0) {
      local_a0.m_name._M_dataplus._M_p._0_4_ = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&layoutFlagCandidates,(uint *)&local_a0);
      uVar6 = this->m_features;
    }
    if ((uVar6 >> 10 & 1) != 0) {
      local_a0.m_name._M_dataplus._M_p._0_4_ = 4;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&layoutFlagCandidates,(uint *)&local_a0);
    }
    uVar6 = de::Random::
            choose<unsigned_int,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                      ((Random *)&rnd.m_rnd,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )layoutFlagCandidates.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        )layoutFlagCandidates.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    if ((this->m_features & 0x1000) != 0) {
      uVar7 = de::Random::choose<unsigned_int,unsigned_int_const*>
                        ((Random *)&rnd.m_rnd,
                         (uint *)(anonymous_namespace)::RandomSSBOLayoutCase::
                                 generateBlock(de::Random&,unsigned_int)::matrixCandidates,
                         generateType::precisionCandidates);
      uVar6 = uVar6 | uVar7;
    }
    this_01->m_flags = uVar6;
    iVar10 = 0;
    iVar11 = 0;
    if (0 < iVar5) {
      iVar11 = iVar5;
    }
    for (; iVar11 != iVar10; iVar10 = iVar10 + 1) {
      uVar6 = this->m_features;
      (anonymous_namespace)::genName_abi_cxx11_
                (&name,(_anonymous_namespace_ *)0x61,'z',(char)this->m_bufferVarNdx,(int)in_R8);
      in_R8 = 1;
      generateType(&type,this,(Random *)&rnd.m_rnd,0,true,
                   (bool)((byte)(this->m_features >> 0xd) & 1 & iVar5 + -1 == iVar10));
      if ((uVar6 & 0x40) == 0) {
LAB_0046dd0d:
        fVar13 = deRandom_getFloat(&rnd.m_rnd);
        if (0.7 <= fVar13) {
          uVar6 = 0;
          uVar7 = 0x1000;
        }
        else {
          fVar13 = deRandom_getFloat(&rnd.m_rnd);
          uVar7 = (uint)(fVar13 < 0.7) << 0xc;
          uVar6 = 0x800;
        }
      }
      else {
        fVar13 = deRandom_getFloat(&rnd.m_rnd);
        uVar7 = 0;
        uVar6 = 0;
        if (fVar13 < 0.85) goto LAB_0046dd0d;
      }
      bb::BufferVar::BufferVar(&local_a0,name._M_dataplus._M_p,&type,uVar7 | uVar6);
      std::vector<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>::
      push_back(&this_01->m_variables,&local_a0);
      bb::BufferVar::~BufferVar(&local_a0);
      this->m_bufferVarNdx = this->m_bufferVarNdx + 1;
      glu::VarType::~VarType(&type);
      std::__cxx11::string::~string((string *)&name);
    }
    if (((0 < iVar5) &&
        (pBVar1 = (this_01->m_variables).
                  super__Vector_base<deqp::gles31::bb::BufferVar,_std::allocator<deqp::gles31::bb::BufferVar>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pBVar1[-1].m_type.m_type == TYPE_ARRAY
        )) && (pBVar1[-1].m_type.m_data.array.size == -1)) {
      uVar6 = iVar4 + (uint)(iVar4 == 0);
      if ((int)uVar6 < 1) {
        uVar6 = 0;
      }
      for (uVar12 = 0; uVar6 != uVar12; uVar12 = uVar12 + 1) {
        iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,this->m_maxArrayLength);
        (this_01->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar12] = iVar4;
      }
    }
    this->m_blockNdx = this->m_blockNdx + 1;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&layoutFlagCandidates.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
              );
    uVar8 = uVar8 + 1;
    pSVar9 = (ShaderInterface *)(ulong)uVar8;
  } while( true );
}

Assistant:

void RandomSSBOLayoutCase::init (void)
{
	de::Random rnd(m_seed);

	const int numBlocks = rnd.getInt(1, m_maxBlocks);

	for (int ndx = 0; ndx < numBlocks; ndx++)
		generateBlock(rnd, 0);
}